

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::FinishTransferSwept(Recycler *this,CollectionFlags flags)

{
  code *pcVar1;
  bool bVar2;
  CollectionState CVar3;
  undefined4 *puVar4;
  CollectionFlags flags_local;
  Recycler *this_local;
  
  CVar3 = ObservableValue::operator_cast_to_CollectionState
                    ((ObservableValue *)&this->collectionState);
  if (CVar3 != CollectionStateTransferSweptWait) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1794,"(collectionState == CollectionStateTransferSweptWait)",
                       "collectionState == CollectionStateTransferSweptWait");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  PrintCollectTrace(this,ConcurrentSweepPhase,true,false);
  SetCollectionState(this,CollectionStateTransferSwept);
  if ((DAT_01eca380 & 1) != 0) {
    bVar2 = HeapInfoManager::HasZeroQueuedPages(&this->autoHeap);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x179e,"(!autoHeap.HasZeroQueuedPages())","!autoHeap.HasZeroQueuedPages()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    HeapInfoManager::FlushBackgroundPages(&this->autoHeap);
  }
  if (this->recyclerSweepManager == (RecyclerSweepManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x17a6,"(this->recyclerSweepManager != nullptr)",
                       "this->recyclerSweepManager != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = RecyclerSweepManager::IsBackground(this->recyclerSweepManager);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x17a7,"(!this->recyclerSweepManager->IsBackground())",
                       "!this->recyclerSweepManager->IsBackground()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((this->inPartialCollectMode & 1U) == 0) {
    ConcurrentTransferSweptObjects(this,this->recyclerSweepManager);
  }
  else {
    ConcurrentPartialTransferSweptObjects(this,this->recyclerSweepManager);
  }
  RecyclerSweepManager::EndSweep(this->recyclerSweepManager);
  return;
}

Assistant:

void
Recycler::FinishTransferSwept(CollectionFlags flags)
{
    GCETW_INTERNAL(GC_START, (this, ETWEvent_ConcurrentTransferSwept));
    GCETW_INTERNAL(GC_START2, (this, ETWEvent_ConcurrentTransferSwept, this->collectionStartReason, this->collectionStartFlags));
    GCETW(GC_FLUSHZEROPAGE_START, (this));

    Assert(collectionState == CollectionStateTransferSweptWait);
#ifdef RECYCLER_TRACE
    PrintCollectTrace(Js::ConcurrentSweepPhase, true);
#endif
    SetCollectionState(CollectionStateTransferSwept);

#if ENABLE_BACKGROUND_PAGE_FREEING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        // We should have zeroed all the pages in the background thread
        Assert(!autoHeap.HasZeroQueuedPages());
        autoHeap.FlushBackgroundPages();
    }
#endif

    GCETW(GC_FLUSHZEROPAGE_STOP, (this));
    GCETW(GC_TRANSFERSWEPTOBJECTS_START, (this));

    Assert(this->recyclerSweepManager != nullptr);
    Assert(!this->recyclerSweepManager->IsBackground());
#if ENABLE_PARTIAL_GC
    if (this->inPartialCollectMode)
    {
        ConcurrentPartialTransferSweptObjects(*this->recyclerSweepManager);
    }
    else
#endif
    {
        ConcurrentTransferSweptObjects(*this->recyclerSweepManager);
    }
    recyclerSweepManager->EndSweep();

    GCETW(GC_TRANSFERSWEPTOBJECTS_STOP, (this));

    GCETW_INTERNAL(GC_STOP, (this, ETWEvent_ConcurrentTransferSwept));
    GCETW_INTERNAL(GC_STOP2, (this, ETWEvent_ConcurrentTransferSwept, this->collectionStartReason, this->collectionStartFlags));
}